

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O0

void __thiscall
RenX_ExtraLoggingPlugin::RenX_OnRaw(RenX_ExtraLoggingPlugin *this,Server *server,string_view raw)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  const_pointer pvVar4;
  size_type sVar5;
  undefined1 local_78 [8];
  string fPrefix;
  undefined1 local_48 [8];
  string cPrefix;
  Server *server_local;
  RenX_ExtraLoggingPlugin *this_local;
  string_view raw_local;
  
  raw_local._M_len = (size_t)raw._M_str;
  this_local = (RenX_ExtraLoggingPlugin *)raw._M_len;
  cPrefix.field_2._8_8_ = server;
  if ((this->printToConsole & 1U) != 0) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->consolePrefix);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_48,&this->consolePrefix);
      RenX::processTags((string *)local_48,(Server *)cPrefix.field_2._8_8_,(PlayerInfo *)0x0,
                        (PlayerInfo *)0x0,(BuildingInfo *)0x0);
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48);
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48);
      fwrite(pcVar2,1,sVar3,_stdout);
      fputc(0x20,_stdout);
      std::__cxx11::string::~string((string *)local_48);
    }
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    fwrite(pvVar4,1,sVar5,_stdout);
    fputs("\r\n",_stdout);
  }
  if (this->file != (FILE *)0x0) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->filePrefix);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_78,&this->filePrefix);
      RenX::processTags((string *)local_78,(Server *)cPrefix.field_2._8_8_,(PlayerInfo *)0x0,
                        (PlayerInfo *)0x0,(BuildingInfo *)0x0);
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
      fwrite(pcVar2,1,sVar3,(FILE *)this->file);
      fputc(0x20,(FILE *)this->file);
      std::__cxx11::string::~string((string *)local_78);
    }
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    fwrite(pvVar4,1,sVar5,(FILE *)this->file);
    fputs("\r\n",(FILE *)this->file);
    fflush((FILE *)this->file);
  }
  return;
}

Assistant:

void RenX_ExtraLoggingPlugin::RenX_OnRaw(RenX::Server &server, std::string_view raw) {
	if (RenX_ExtraLoggingPlugin::printToConsole) {
		if (!RenX_ExtraLoggingPlugin::consolePrefix.empty()) {
			std::string cPrefix = RenX_ExtraLoggingPlugin::consolePrefix;
			RenX::processTags(cPrefix, &server);
			fwrite(cPrefix.data(), sizeof(char), cPrefix.size(), stdout);
			fputc(' ', stdout);
		}
		fwrite(raw.data(), sizeof(char), raw.size(), stdout);
		fputs("\r\n", stdout);
	}

	if (RenX_ExtraLoggingPlugin::file != nullptr) {
		if (!RenX_ExtraLoggingPlugin::filePrefix.empty()) {
			std::string fPrefix = RenX_ExtraLoggingPlugin::filePrefix;
			RenX::processTags(fPrefix, &server);
			fwrite(fPrefix.data(), sizeof(char), fPrefix.size(), file);
			fputc(' ', RenX_ExtraLoggingPlugin::file);
		}
		fwrite(raw.data(), sizeof(char), raw.size(), file);
		fputs("\r\n", file);
		fflush(RenX_ExtraLoggingPlugin::file);
	}
}